

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexArrayTest.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::SingleVertexArrayTestGroup::init
          (SingleVertexArrayTestGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  SingleVertexArrayTestGroup *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  SingleVertexArrayStrideTests::SingleVertexArrayStrideTests
            ((SingleVertexArrayStrideTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  SingleVertexArrayNormalizeTests::SingleVertexArrayNormalizeTests
            ((SingleVertexArrayNormalizeTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  SingleVertexArrayOutputTypeTests::SingleVertexArrayOutputTypeTests
            ((SingleVertexArrayOutputTypeTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  SingleVertexArrayUsageTests::SingleVertexArrayUsageTests
            ((SingleVertexArrayUsageTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  SingleVertexArrayOffsetTests::SingleVertexArrayOffsetTests
            ((SingleVertexArrayOffsetTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  SingleVertexArrayFirstTests::SingleVertexArrayFirstTests
            ((SingleVertexArrayFirstTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void SingleVertexArrayTestGroup::init (void)
{
	addChild(new SingleVertexArrayStrideTests(m_context));
	addChild(new SingleVertexArrayNormalizeTests(m_context));
	addChild(new SingleVertexArrayOutputTypeTests(m_context));
	addChild(new SingleVertexArrayUsageTests(m_context));
	addChild(new SingleVertexArrayOffsetTests(m_context));
	addChild(new SingleVertexArrayFirstTests(m_context));
}